

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O1

void __thiscall
QNetworkReplyHttpImplPrivate::replySslErrors
          (QNetworkReplyHttpImplPrivate *this,QList<QSslError> *list,bool *ignoreAll,
          QList<QSslError> *toBeIgnored)

{
  QNetworkReply::sslErrors(*(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8,list);
  if (this->pendingIgnoreAllSslErrors == true) {
    *ignoreAll = true;
  }
  if ((this->pendingIgnoreSslErrorsList).d.size != 0) {
    QArrayDataPointer<QSslError>::operator=(&toBeIgnored->d,&(this->pendingIgnoreSslErrorsList).d);
    return;
  }
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::replySslErrors(
        const QList<QSslError> &list, bool *ignoreAll, QList<QSslError> *toBeIgnored)
{
    Q_Q(QNetworkReplyHttpImpl);
    emit q->sslErrors(list);
    // Check if the callback set any ignore and return this here to http thread
    if (pendingIgnoreAllSslErrors)
        *ignoreAll = true;
    if (!pendingIgnoreSslErrorsList.isEmpty())
        *toBeIgnored = pendingIgnoreSslErrorsList;
}